

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionEndStr.cpp
# Opt level: O1

void __thiscall
Hpipe::InstructionEndStr::write_dot
          (InstructionEndStr *this,ostream *os,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *edge_labels)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"END_STR(",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(this->var)._M_dataplus._M_p,(this->var)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return;
}

Assistant:

void InstructionEndStr::write_dot( std::ostream &os, std::vector<std::string> *edge_labels ) const {
    os << "END_STR(" << var << "," << want_next_char << ")";
}